

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O0

void __thiscall xe::TestCaseResultHeader::~TestCaseResultHeader(TestCaseResultHeader *this)

{
  TestCaseResultHeader *this_local;
  
  std::__cxx11::string::~string((string *)&this->statusDetails);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

TestCaseResultHeader	(void) : caseType(TESTCASETYPE_LAST), statusCode(TESTSTATUSCODE_LAST) {}